

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCBoolean.cpp
# Opt level: O0

bool Assimp::IFC::PointInPoly
               (IfcVector3 *p,
               vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *boundary)

{
  bool bVar1;
  size_type sVar2;
  aiVector3t<double> local_d8;
  aiVector3t<double> local_c0;
  aiVector3t<double> local_a8;
  aiVector3t<double> local_90;
  aiVector3t<double> local_68;
  aiVector3t<double> local_50;
  ulong local_38;
  size_t votes;
  vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
  intersected_boundary;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *boundary_local;
  IfcVector3 *p_local;
  
  intersected_boundary.
  super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boundary;
  std::
  vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
  ::vector((vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
            *)&votes);
  local_38 = 0;
  aiVector3t<double>::aiVector3t(&local_68,1.0,0.0,0.0);
  ::operator+(&local_50,p,&local_68);
  IntersectsBoundaryProfile
            (p,&local_50,
             (vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
             intersected_boundary.
             super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,true,
             (vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
              *)&votes,true);
  sVar2 = std::
          vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
          ::size((vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                  *)&votes);
  local_38 = local_38 + ((uint)sVar2 & 1);
  std::
  vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
  ::clear((vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
           *)&votes);
  aiVector3t<double>::aiVector3t(&local_a8,0.0,1.0,0.0);
  ::operator+(&local_90,p,&local_a8);
  IntersectsBoundaryProfile
            (p,&local_90,
             (vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
             intersected_boundary.
             super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,true,
             (vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
              *)&votes,true);
  sVar2 = std::
          vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
          ::size((vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                  *)&votes);
  local_38 = local_38 + ((uint)sVar2 & 1);
  std::
  vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
  ::clear((vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
           *)&votes);
  aiVector3t<double>::aiVector3t(&local_d8,0.6,-0.6,0.0);
  ::operator+(&local_c0,p,&local_d8);
  IntersectsBoundaryProfile
            (p,&local_c0,
             (vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
             intersected_boundary.
             super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,true,
             (vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
              *)&votes,true);
  sVar2 = std::
          vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
          ::size((vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                  *)&votes);
  local_38 = (sVar2 & 1) + local_38;
  bVar1 = 1 < local_38;
  std::
  vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
  ::~vector((vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
             *)&votes);
  return bVar1;
}

Assistant:

bool PointInPoly(const IfcVector3& p, const std::vector<IfcVector3>& boundary)
{
    // even-odd algorithm: take a random vector that extends from p to infinite
    // and counts how many times it intersects edges of the boundary.
    // because checking for segment intersections is prone to numeric inaccuracies
    // or double detections (i.e. when hitting multiple adjacent segments at their
    // shared vertices) we do it thrice with different rays and vote on it.

    // the even-odd algorithm doesn't work for points which lie directly on
    // the border of the polygon. If any of our attempts produces this result,
    // we return false immediately.

    std::vector<std::pair<size_t, IfcVector3> > intersected_boundary;
    size_t votes = 0;

    IntersectsBoundaryProfile(p, p + IfcVector3(1.0, 0, 0), boundary, true, intersected_boundary, true);
    votes += intersected_boundary.size() % 2;

    intersected_boundary.clear();
    IntersectsBoundaryProfile(p, p + IfcVector3(0, 1.0, 0), boundary, true, intersected_boundary, true);
    votes += intersected_boundary.size() % 2;

    intersected_boundary.clear();
    IntersectsBoundaryProfile(p, p + IfcVector3(0.6, -0.6, 0.0), boundary, true, intersected_boundary, true);
    votes += intersected_boundary.size() % 2;

    return votes > 1;
}